

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathSubstringFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  int iVar1;
  xmlXPathObjectPtr pxVar2;
  xmlXPathObjectPtr pxVar3;
  xmlChar *val;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  if ((nargs < 2) || (3 < nargs)) {
    if (ctxt == (xmlXPathParserContextPtr)0x0) {
      return;
    }
    iVar5 = 0xc;
    goto LAB_001c4fab;
  }
  dVar10 = 0.0;
  if (nargs == 3) {
    if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_NUMBER)) {
      xmlXPathNumberFunction(ctxt,1);
    }
    if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type == XPATH_NUMBER)) {
      pxVar2 = valuePop(ctxt);
      dVar10 = pxVar2->floatval;
      xmlXPathReleaseObject(ctxt->context,pxVar2);
      goto LAB_001c4dc9;
    }
  }
  else {
LAB_001c4dc9:
    if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_NUMBER)) {
      xmlXPathNumberFunction(ctxt,1);
    }
    if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type == XPATH_NUMBER)) {
      pxVar2 = valuePop(ctxt);
      dVar9 = pxVar2->floatval;
      xmlXPathReleaseObject(ctxt->context,pxVar2);
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
        xmlXPathStringFunction(ctxt,1);
      }
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type == XPATH_STRING)) {
        pxVar2 = valuePop(ctxt);
        iVar5 = 0x7fffffff;
        if ((dVar9 < 2147483647.0) && (iVar5 = 1, 1.0 <= dVar9)) {
          iVar5 = (int)dVar9;
          dVar8 = floor(dVar9);
          if (0.5 <= dVar9 - dVar8) {
            iVar5 = iVar5 + 1;
          }
        }
        iVar4 = 0x7ffffffe;
        if (nargs == 3) {
          dVar8 = floor(dVar9);
          uVar6 = -(ulong)(dVar9 - dVar8 < 0.5);
          dVar9 = floor(dVar10);
          uVar7 = -(ulong)(dVar10 - dVar9 < 0.5);
          dVar10 = (double)(uVar7 & (ulong)dVar9 | ~uVar7 & (ulong)(dVar9 + 1.0)) +
                   (double)(uVar6 & (ulong)dVar8 | ~uVar6 & (ulong)(dVar8 + 1.0));
          iVar4 = 0;
          if ((1.0 <= dVar10) && (iVar4 = 0x7ffffffe, dVar10 < 2147483647.0)) {
            iVar4 = (int)dVar10 + -1;
          }
        }
        if (iVar5 <= iVar4) {
          iVar1 = xmlUTF8Strlen(pxVar2->stringval);
          if (iVar5 <= iVar1) {
            val = xmlUTF8Strsub(pxVar2->stringval,iVar5 + -1,iVar4 - (iVar5 + -1));
            if (val == (xmlChar *)0x0) {
              xmlXPathPErrMemory(ctxt);
            }
            pxVar3 = xmlXPathCacheNewString(ctxt,val);
            valuePush(ctxt,pxVar3);
            (*xmlFree)(val);
            goto LAB_001c5003;
          }
        }
        pxVar3 = xmlXPathCacheNewString(ctxt,"");
        valuePush(ctxt,pxVar3);
LAB_001c5003:
        xmlXPathReleaseObject(ctxt->context,pxVar2);
        return;
      }
    }
  }
  iVar5 = 0xb;
LAB_001c4fab:
  xmlXPathErr(ctxt,iVar5);
  return;
}

Assistant:

void
xmlXPathSubstringFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr str, start, len;
    double le=0, in;
    int i = 1, j = INT_MAX;

    if (nargs < 2) {
	CHECK_ARITY(2);
    }
    if (nargs > 3) {
	CHECK_ARITY(3);
    }
    /*
     * take care of possible last (position) argument
    */
    if (nargs == 3) {
	CAST_TO_NUMBER;
	CHECK_TYPE(XPATH_NUMBER);
	len = valuePop(ctxt);
	le = len->floatval;
	xmlXPathReleaseObject(ctxt->context, len);
    }

    CAST_TO_NUMBER;
    CHECK_TYPE(XPATH_NUMBER);
    start = valuePop(ctxt);
    in = start->floatval;
    xmlXPathReleaseObject(ctxt->context, start);
    CAST_TO_STRING;
    CHECK_TYPE(XPATH_STRING);
    str = valuePop(ctxt);

    if (!(in < INT_MAX)) { /* Logical NOT to handle NaNs */
        i = INT_MAX;
    } else if (in >= 1.0) {
        i = (int)in;
        if (in - floor(in) >= 0.5)
            i += 1;
    }

    if (nargs == 3) {
        double rin, rle, end;

        rin = floor(in);
        if (in - rin >= 0.5)
            rin += 1.0;

        rle = floor(le);
        if (le - rle >= 0.5)
            rle += 1.0;

        end = rin + rle;
        if (!(end >= 1.0)) { /* Logical NOT to handle NaNs */
            j = 1;
        } else if (end < INT_MAX) {
            j = (int)end;
        }
    }

    i -= 1;
    j -= 1;

    if ((i < j) && (i < xmlUTF8Strlen(str->stringval))) {
        xmlChar *ret = xmlUTF8Strsub(str->stringval, i, j - i);
        if (ret == NULL)
            xmlXPathPErrMemory(ctxt);
	valuePush(ctxt, xmlXPathCacheNewString(ctxt, ret));
	xmlFree(ret);
    } else {
	valuePush(ctxt, xmlXPathCacheNewCString(ctxt, ""));
    }

    xmlXPathReleaseObject(ctxt->context, str);
}